

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

void Acb_ObjPushToFanout(Acb_Ntk_t *p,int iObj,int iFaninIndex,int iFanout)

{
  int iVar1;
  int iFaninGiven;
  int iVar;
  uint uVar2;
  int iVar3;
  uint uVar4;
  word wVar5;
  word wVar6;
  ulong uVar7;
  word Entry;
  char *__assertion;
  word uTruthObjNew;
  
  uTruthObjNew = 0;
  wVar5 = Acb_ObjTruth(p,iObj);
  wVar6 = Acb_ObjTruth(p,iFanout);
  iVar1 = Abc_Tt6CheckOutDec(wVar5,iFaninIndex,&uTruthObjNew);
  iFaninGiven = Acb_ObjFanin(p,iObj,iFaninIndex);
  iVar = Acb_ObjWhatFanin(p,iFanout,iObj);
  uVar2 = Acb_ObjWhatFanin(p,iFanout,iFaninGiven);
  if (uVar2 == 0xffffffff) {
    uVar2 = Acb_ObjFaninNum(p,iFanout);
  }
  iVar3 = Acb_ObjIsCio(p,iObj);
  if (iVar3 == 0) {
    iVar3 = Acb_ObjIsCio(p,iFanout);
    if (iVar3 == 0) {
      if ((int)uVar2 < 0) {
        __assertion = "iFanoutFaninIndex >= 0";
        uVar2 = 0x39;
      }
      else {
        iVar3 = Acb_ObjFaninNum(p,iObj);
        if (iFaninIndex < iVar3) {
          iVar3 = Acb_ObjFanoutNum(p,iObj);
          if (iVar3 == 1) {
            wVar5 = Abc_Tt6Cofactor0(wVar6,iVar);
            wVar6 = Abc_Tt6Cofactor1(wVar6,iVar);
            switch(iVar1) {
            case 0:
              uVar7 = s_Truths6[iVar] & s_Truths6[uVar2];
              break;
            case 1:
              uVar7 = ~s_Truths6[uVar2] & s_Truths6[iVar];
              break;
            case 2:
              uVar7 = ~s_Truths6[uVar2] | s_Truths6[iVar];
              break;
            case 3:
              uVar7 = s_Truths6[iVar] | s_Truths6[uVar2];
              break;
            case 4:
              uVar7 = s_Truths6[iVar] ^ s_Truths6[uVar2];
              break;
            default:
              __assertion = "0";
              uVar2 = 0x49;
              goto LAB_00313ff3;
            }
            Entry = Abc_Tt6RemoveVar(uTruthObjNew,iFaninIndex);
            Vec_WrdWriteEntry(&p->vObjTruth,iObj,Entry);
            Vec_WrdWriteEntry(&p->vObjTruth,iFanout,(wVar6 ^ wVar5) & uVar7 ^ wVar5);
            Acb_ObjRemoveFaninFanoutOne(p,iObj,iFaninGiven);
            uVar4 = Acb_ObjFaninNum(p,iFanout);
            if (uVar2 == uVar4) {
              Acb_ObjAddFaninFanoutOne(p,iFanout,iFaninGiven);
            }
            return;
          }
          __assertion = "Acb_ObjFanoutNum(p, iObj) == 1";
          uVar2 = 0x3b;
        }
        else {
          __assertion = "iFaninIndex < Acb_ObjFaninNum(p, iObj)";
          uVar2 = 0x3a;
        }
      }
    }
    else {
      __assertion = "!Acb_ObjIsCio(p, iFanout)";
      uVar2 = 0x38;
    }
  }
  else {
    __assertion = "!Acb_ObjIsCio(p, iObj)";
    uVar2 = 0x37;
  }
LAB_00313ff3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                ,uVar2,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Pushing logic to the fanout.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acb_ObjPushToFanout( Acb_Ntk_t * p, int iObj, int iFaninIndex, int iFanout )
{
    word c0, uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj ), Gate;
    word c1, uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanout );
    int DecType = Abc_Tt6CheckOutDec( uTruthObj, iFaninIndex, &uTruthObjNew );
    int iFanin = Acb_ObjFanin( p, iObj, iFaninIndex );
    int iFanoutObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
    int iFanoutFaninIndex = Acb_ObjWhatFanin( p, iFanout, iFanin );
    if ( iFanoutFaninIndex == -1 )
        iFanoutFaninIndex = Acb_ObjFaninNum(p, iFanout); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanout) );
    assert( iFanoutFaninIndex >= 0 );
    assert( iFaninIndex < Acb_ObjFaninNum(p, iObj) );
    assert( Acb_ObjFanoutNum(p, iObj) == 1 );
    // compute new function of the fanout
    c0 = Abc_Tt6Cofactor0( uTruthFan, iFanoutObjIndex );
    c1 = Abc_Tt6Cofactor1( uTruthFan, iFanoutObjIndex );
    if ( DecType == 0 ) //  F = i * G
        Gate =  s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 1 ) //  F = ~i * G
        Gate = ~s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 2 ) //  F = ~i + G
        Gate = ~s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 3 ) //  F = i + G
        Gate =  s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 4 ) //  F = i # G
        Gate =  s_Truths6[iFanoutFaninIndex] ^ s_Truths6[iFanoutObjIndex];
    else assert( 0 );
    uTruthFanNew = (~Gate & c0) | (Gate & c1);
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanout, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin );
    if ( iFanoutFaninIndex == Acb_ObjFaninNum(p, iFanout) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanout, iFanin );
}